

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O1

bool __thiscall spvtools::opt::Instruction::IsScalarizable(Instruction *this)

{
  uint32_t uVar1;
  IRContext *this_00;
  bool bVar2;
  byte bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  
  bVar2 = spvOpcodeIsScalarizable(this->opcode_);
  bVar3 = 1;
  if (!bVar2) {
    if (this->opcode_ == OpExtInst) {
      this_00 = this->context_;
      if ((this_00->feature_mgr_)._M_t.
          super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
          .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl ==
          (FeatureManager *)0x0) {
        IRContext::AnalyzeFeatures(this_00);
      }
      uVar1 = ((this_00->feature_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
               .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl)->
              extinst_importid_GLSLstd450_;
      uVar6 = (this->has_result_id_ & 1) + 1;
      if (this->has_type_id_ == false) {
        uVar6 = (uint)this->has_result_id_;
      }
      uVar4 = GetSingleWordOperand(this,uVar6);
      uVar6 = uVar4;
      if (uVar4 == uVar1) {
        uVar7 = (this->has_result_id_ & 1) + 1;
        if (this->has_type_id_ == false) {
          uVar7 = (uint)this->has_result_id_;
        }
        uVar5 = GetSingleWordOperand(this,uVar7 + 1);
        uVar6 = 1;
        switch(uVar5) {
        case 1:
        case 2:
        case 3:
        case 4:
        case 5:
        case 6:
        case 7:
        case 8:
        case 9:
        case 10:
        case 0xb:
        case 0xc:
        case 0xd:
        case 0xe:
        case 0xf:
        case 0x10:
        case 0x11:
        case 0x12:
        case 0x13:
        case 0x14:
        case 0x15:
        case 0x16:
        case 0x17:
        case 0x18:
        case 0x19:
        case 0x1a:
        case 0x1b:
        case 0x1c:
        case 0x1d:
        case 0x1e:
        case 0x1f:
        case 0x20:
        case 0x23:
        case 0x25:
        case 0x26:
        case 0x27:
        case 0x28:
        case 0x29:
        case 0x2a:
        case 0x2b:
        case 0x2c:
        case 0x2d:
        case 0x2e:
        case 0x30:
        case 0x31:
        case 0x32:
        case 0x33:
        case 0x35:
        case 0x49:
        case 0x4a:
        case 0x4b:
        case 0x4f:
        case 0x50:
        case 0x51:
          break;
        default:
          uVar6 = 0;
        }
      }
      bVar3 = (byte)uVar6;
      if (uVar4 == uVar1) goto LAB_005916cf;
    }
    bVar3 = 0;
  }
LAB_005916cf:
  return (bool)(bVar3 & 1);
}

Assistant:

bool Instruction::IsScalarizable() const {
  if (spvOpcodeIsScalarizable(opcode())) {
    return true;
  }

  if (opcode() == spv::Op::OpExtInst) {
    uint32_t instSetId =
        context()->get_feature_mgr()->GetExtInstImportId_GLSLstd450();

    if (GetSingleWordInOperand(kExtInstSetIdInIdx) == instSetId) {
      switch (GetSingleWordInOperand(kExtInstInstructionInIdx)) {
        case GLSLstd450Round:
        case GLSLstd450RoundEven:
        case GLSLstd450Trunc:
        case GLSLstd450FAbs:
        case GLSLstd450SAbs:
        case GLSLstd450FSign:
        case GLSLstd450SSign:
        case GLSLstd450Floor:
        case GLSLstd450Ceil:
        case GLSLstd450Fract:
        case GLSLstd450Radians:
        case GLSLstd450Degrees:
        case GLSLstd450Sin:
        case GLSLstd450Cos:
        case GLSLstd450Tan:
        case GLSLstd450Asin:
        case GLSLstd450Acos:
        case GLSLstd450Atan:
        case GLSLstd450Sinh:
        case GLSLstd450Cosh:
        case GLSLstd450Tanh:
        case GLSLstd450Asinh:
        case GLSLstd450Acosh:
        case GLSLstd450Atanh:
        case GLSLstd450Atan2:
        case GLSLstd450Pow:
        case GLSLstd450Exp:
        case GLSLstd450Log:
        case GLSLstd450Exp2:
        case GLSLstd450Log2:
        case GLSLstd450Sqrt:
        case GLSLstd450InverseSqrt:
        case GLSLstd450Modf:
        case GLSLstd450FMin:
        case GLSLstd450UMin:
        case GLSLstd450SMin:
        case GLSLstd450FMax:
        case GLSLstd450UMax:
        case GLSLstd450SMax:
        case GLSLstd450FClamp:
        case GLSLstd450UClamp:
        case GLSLstd450SClamp:
        case GLSLstd450FMix:
        case GLSLstd450Step:
        case GLSLstd450SmoothStep:
        case GLSLstd450Fma:
        case GLSLstd450Frexp:
        case GLSLstd450Ldexp:
        case GLSLstd450FindILsb:
        case GLSLstd450FindSMsb:
        case GLSLstd450FindUMsb:
        case GLSLstd450NMin:
        case GLSLstd450NMax:
        case GLSLstd450NClamp:
          return true;
        default:
          return false;
      }
    }
  }
  return false;
}